

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteTargetLanguageFlags(cmMakefileTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmMakefile *this_00;
  cmGeneratedFileStream *pcVar2;
  pointer pbVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  pointer arch;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string flags;
  string compiler;
  string defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string local_150;
  string local_130;
  string local_110;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined8 local_d0;
  _Rb_tree_node_base *local_c8;
  long *local_c0 [2];
  long local_b0 [2];
  char local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CMAKE_BUILD_TYPE","");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_110);
  cmGeneratorTarget::GetLanguages
            (pcVar1,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_60,psVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_110._M_dataplus._M_p = (pointer)0x6;
      local_110._M_string_length = 0x7ecd63;
      local_110.field_2._M_allocated_capacity = 0;
      local_f0 = *(undefined8 *)(p_Var7 + 1);
      local_110.field_2._8_8_ = p_Var7[1]._M_parent;
      local_e8 = 0;
      local_e0 = 9;
      local_d8 = "_COMPILER";
      local_d0 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&local_110;
      cmCatViews(&local_130,views);
      pcVar2 = (this->FlagFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"# compile ",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)pcVar2,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," with ",6);
      psVar5 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_130);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header);
  }
  iVar4 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x47])();
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      GetConfigName_abi_cxx11_(&local_130,this);
      local_c8 = p_Var7 + 1;
      cmCommonTargetGenerator::GetDefines
                (&local_110,&this->super_cmCommonTargetGenerator,(string *)local_c8,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      GetConfigName_abi_cxx11_(&local_150,this);
      cmCommonTargetGenerator::GetIncludes
                (&local_130,&this->super_cmCommonTargetGenerator,(string *)local_c8,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((char)iVar4 != '\0') {
        cmsys::SystemTools::ReplaceString(&local_110,"#","\\#");
        cmsys::SystemTools::ReplaceString(&local_130,"#","\\#");
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)
                          (this->FlagFileStream)._M_t.
                          super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                          .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                          *(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_DEFINES = ",0xb);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)
                          (this->FlagFileStream)._M_t.
                          super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                          .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                          *(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_INCLUDES = ",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_(&local_150,this);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      local_a0 = '\x01';
      cmGeneratorTarget::GetAppleArchs
                (&local_98,pcVar1,&local_150,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0);
      if (local_a0 == '\x01') {
        local_a0 = '\0';
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_98);
      pbVar3 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (arch = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; arch != pbVar3; arch = arch + 1) {
        GetConfigName_abi_cxx11_(&local_80,this);
        cmCommonTargetGenerator::GetFlags
                  (&local_150,&this->super_cmCommonTargetGenerator,(string *)local_c8,&local_80,arch
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((char)iVar4 != '\0') {
          cmsys::SystemTools::ReplaceString(&local_150,"#","\\#");
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            (this->FlagFileStream)._M_t.
                            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                            *(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_FLAGS",6);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(arch->_M_dataplus)._M_p,arch->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_150._M_dataplus._M_p,local_150._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetLanguageFlags()
{
  // write language flags for target
  std::set<std::string> languages;
  this->GeneratorTarget->GetLanguages(
    languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  // put the compiler in the rules.make file so that if it changes
  // things rebuild
  for (std::string const& language : languages) {
    std::string compiler = cmStrCat("CMAKE_", language, "_COMPILER");
    *this->FlagFileStream << "# compile " << language << " with "
                          << this->Makefile->GetSafeDefinition(compiler)
                          << "\n";
  }

  bool const escapeOctothorpe = this->GlobalGenerator->CanEscapeOctothorpe();

  for (std::string const& language : languages) {
    std::string defines = this->GetDefines(language, this->GetConfigName());
    std::string includes = this->GetIncludes(language, this->GetConfigName());
    if (escapeOctothorpe) {
      // Escape comment characters so they do not terminate assignment.
      cmSystemTools::ReplaceString(defines, "#", "\\#");
      cmSystemTools::ReplaceString(includes, "#", "\\#");
    }
    *this->FlagFileStream << language << "_DEFINES = " << defines << "\n\n";
    *this->FlagFileStream << language << "_INCLUDES = " << includes << "\n\n";

    std::vector<std::string> architectures =
      this->GeneratorTarget->GetAppleArchs(this->GetConfigName(), language);
    architectures.emplace_back();

    for (const std::string& arch : architectures) {
      std::string flags =
        this->GetFlags(language, this->GetConfigName(), arch);
      if (escapeOctothorpe) {
        cmSystemTools::ReplaceString(flags, "#", "\\#");
      }
      *this->FlagFileStream << language << "_FLAGS" << arch << " = " << flags
                            << "\n\n";
    }
  }
}